

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandPrintUnate(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  char *pcVar2;
  uint local_40;
  uint local_3c;
  int fVerbose;
  int fUseNaive;
  int fUseBdds;
  int c;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk_00 = Abc_FrameReadNtk(pAbc);
  fVerbose = 1;
  local_3c = 0;
  local_40 = 0;
  Extra_UtilGetoptReset();
LAB_00262acc:
  iVar1 = Extra_UtilGetopt(argc,argv,"bnvh");
  if (iVar1 == -1) {
    if (pNtk_00 == (Abc_Ntk_t *)0x0) {
      Abc_Print(-1,"Empty network.\n");
      pAbc_local._4_4_ = 1;
    }
    else {
      iVar1 = Abc_NtkIsStrash(pNtk_00);
      if (iVar1 == 0) {
        Abc_Print(-1,"This command works only for AIGs (run \"strash\").\n");
        pAbc_local._4_4_ = 1;
      }
      else {
        Abc_NtkPrintUnate(pNtk_00,fVerbose,local_3c,local_40);
        pAbc_local._4_4_ = 0;
      }
    }
    return pAbc_local._4_4_;
  }
  switch(iVar1) {
  case 0x62:
    fVerbose = fVerbose ^ 1;
    goto LAB_00262acc;
  default:
    break;
  case 0x68:
    break;
  case 0x6e:
    local_3c = local_3c ^ 1;
    goto LAB_00262acc;
  case 0x76:
    goto switchD_00262b0a_caseD_76;
  }
  Abc_Print(-2,"usage: print_unate [-bnvh]\n");
  Abc_Print(-2,"\t         computes unate variables of the PO functions\n");
  pcVar2 = "SAT";
  if (fVerbose != 0) {
    pcVar2 = "BDD";
  }
  Abc_Print(-2,"\t-b     : toggle BDD-based or SAT-based computations [default = %s].\n",pcVar2);
  pcVar2 = "no";
  if (local_3c != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-n     : toggle naive BDD-based computation [default = %s].\n",pcVar2);
  pcVar2 = "no";
  if (local_40 != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-v     : enable verbose output [default = %s].\n",pcVar2);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
switchD_00262b0a_caseD_76:
  local_40 = local_40 ^ 1;
  goto LAB_00262acc;
}

Assistant:

int Abc_CommandPrintUnate( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    int fUseBdds;
    int fUseNaive;
    int fVerbose;
    extern void Abc_NtkPrintUnate( Abc_Ntk_t * pNtk, int fUseBdds, int fUseNaive, int fVerbose );

    // set defaults
    fUseBdds  = 1;
    fUseNaive = 0;
    fVerbose  = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "bnvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'b':
            fUseBdds ^= 1;
            break;
        case 'n':
            fUseNaive ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "This command works only for AIGs (run \"strash\").\n" );
        return 1;
    }
    Abc_NtkPrintUnate( pNtk, fUseBdds, fUseNaive, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: print_unate [-bnvh]\n" );
    Abc_Print( -2, "\t         computes unate variables of the PO functions\n" );
    Abc_Print( -2, "\t-b     : toggle BDD-based or SAT-based computations [default = %s].\n", fUseBdds? "BDD": "SAT" );
    Abc_Print( -2, "\t-n     : toggle naive BDD-based computation [default = %s].\n", fUseNaive? "yes": "no" );
    Abc_Print( -2, "\t-v     : enable verbose output [default = %s].\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}